

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError file2memory(char **bufp,size_t *size,FILE *file)

{
  void *pvVar1;
  size_t sVar2;
  size_t nread;
  size_t nused;
  size_t alloc;
  char *buffer;
  char *newbuf;
  FILE *file_local;
  size_t *size_local;
  char **bufp_local;
  
  alloc = 0;
  nused = 0x200;
  nread = 0;
  if (file != (FILE *)0x0) {
    do {
      if ((alloc == 0) || (pvVar1 = (void *)alloc, nused == nread)) {
        if (0x7fffffffffffffff < nused + 1) {
          if (alloc != 0) {
            free((void *)alloc);
          }
          return PARAM_NO_MEM;
        }
        nused = nused * 2;
        pvVar1 = realloc((void *)alloc,nused + 1);
        if (pvVar1 == (void *)0x0) {
          if (alloc != 0) {
            free((void *)alloc);
          }
          return PARAM_NO_MEM;
        }
      }
      alloc = (size_t)pvVar1;
      sVar2 = fread((void *)(alloc + nread),1,nused - nread,(FILE *)file);
      nread = sVar2 + nread;
    } while (sVar2 != 0);
    *(undefined1 *)(alloc + nread) = 0;
    pvVar1 = (void *)alloc;
    if ((nused != nread) && (pvVar1 = realloc((void *)alloc,nread + 1), pvVar1 == (void *)0x0)) {
      if (alloc != 0) {
        free((void *)alloc);
      }
      return PARAM_NO_MEM;
    }
    alloc = (size_t)pvVar1;
    if ((nread == 0) && (alloc != 0)) {
      free((void *)alloc);
      alloc = 0;
    }
  }
  *size = nread;
  *bufp = (char *)alloc;
  return PARAM_OK;
}

Assistant:

ParameterError file2memory(char **bufp, size_t *size, FILE *file)
{
  char *newbuf;
  char *buffer = NULL;
  size_t alloc = 512;
  size_t nused = 0;
  size_t nread;

  if(file) {
    do {
      if(!buffer || (alloc == nused)) {
        /* size_t overflow detection for huge files */
        if(alloc+1 > ((size_t)-1)/2) {
          Curl_safefree(buffer);
          return PARAM_NO_MEM;
        }
        alloc *= 2;
        /* allocate an extra char, reserved space, for null termination */
        if((newbuf = realloc(buffer, alloc+1)) == NULL) {
          Curl_safefree(buffer);
          return PARAM_NO_MEM;
        }
        buffer = newbuf;
      }
      nread = fread(buffer+nused, 1, alloc-nused, file);
      nused += nread;
    } while(nread);
    /* null terminate the buffer in case it's used as a string later */
    buffer[nused] = '\0';
    /* free trailing slack space, if possible */
    if(alloc != nused) {
      if((newbuf = realloc(buffer, nused+1)) == NULL) {
        Curl_safefree(buffer);
        return PARAM_NO_MEM;
      }
      buffer = newbuf;
    }
    /* discard buffer if nothing was read */
    if(!nused) {
      Curl_safefree(buffer); /* no string */
    }
  }
  *size = nused;
  *bufp = buffer;
  return PARAM_OK;
}